

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

Point2f __thiscall pbrt::CylindricalMapping2D::cylinder(CylindricalMapping2D *this,Point3f *p)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar7 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  fVar5 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  fVar6 = (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->textureFromRender).m.m[0][1])),
                           ZEXT416((uint)fVar7),ZEXT416((uint)(this->textureFromRender).m.m[0][0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  fVar8 = auVar4._0_4_ + (this->textureFromRender).m.m[0][3];
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)fVar7),ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  fVar2 = auVar4._0_4_ + (this->textureFromRender).m.m[1][3];
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->textureFromRender).m.m[2][1])),
                           ZEXT416((uint)fVar7),ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  fVar3 = auVar4._0_4_ + (this->textureFromRender).m.m[2][3];
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->textureFromRender).m.m[3][1])),
                           ZEXT416((uint)fVar7),ZEXT416((uint)(this->textureFromRender).m.m[3][0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->textureFromRender).m.m[3][2]));
  fVar7 = auVar4._0_4_ + (this->textureFromRender).m.m[3][3];
  bVar1 = fVar7 == 1.0;
  fVar5 = (float)((uint)bVar1 * (int)fVar8 + (uint)!bVar1 * (int)(fVar8 / fVar7));
  fVar6 = (float)((uint)bVar1 * (int)fVar2 + (uint)!bVar1 * (int)(fVar2 / fVar7));
  fVar7 = (float)((uint)bVar1 * (int)fVar3 + (uint)!bVar1 * (int)(fVar3 / fVar7));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),ZEXT416((uint)fVar5),ZEXT416((uint)fVar5))
  ;
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
  if (auVar4._0_4_ < 0.0) {
    fVar8 = sqrtf(auVar4._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar8 = auVar4._0_4_;
  }
  fVar5 = atan2f(fVar6 / fVar8,fVar5 / fVar8);
  auVar4 = vinsertps_avx(ZEXT416((uint)((fVar5 + 3.1415927) * 0.15915494)),
                         ZEXT416((uint)(fVar7 / fVar8)),0x10);
  return (Point2f)auVar4._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f cylinder(const Point3f &p) const {
        Vector3f vec = Normalize(textureFromRender(p) - Point3f(0, 0, 0));
        return Point2f((Pi + std::atan2(vec.y, vec.x)) * Inv2Pi, vec.z);
    }